

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O0

void __thiscall Peer::Peer(Peer *this,P2PSocket *socket,SocketResource peer,int num)

{
  uint16_t uVar1;
  Socket __fd;
  ostream *this_00;
  char *pcVar2;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  socklen_t local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_40;
  socklen_t local_3c;
  int ret;
  socklen_t len;
  sockaddr_in address;
  int num_local;
  P2PSocket *socket_local;
  Peer *this_local;
  SocketResource peer_local;
  
  this->m_master = socket;
  address.sin_zero._4_4_ = num;
  this_local._4_4_ = peer.m_socket;
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::string::string((string *)&this->m_ip);
  (this->m_socket).m_socket = this_local._4_4_;
  this->m_flags = '\0';
  ret._0_2_ = 0;
  ret._2_1_ = '\0';
  ret._3_1_ = '\0';
  len._0_1_ = '\0';
  len._1_1_ = '\0';
  len._2_1_ = '\0';
  len._3_1_ = '\0';
  address.sin_family = 0;
  address.sin_port = 0;
  address.sin_addr.s_addr = 0;
  local_3c = 0x10;
  __fd = SocketResource::resource((SocketResource *)((long)&this_local + 4));
  local_40 = getpeername(__fd,(sockaddr *)&ret,&local_3c);
  if (local_40 == -1) {
    std::__cxx11::to_string(&local_b0,address.sin_zero._4_4_);
    std::operator+(&local_90,"New peer connection ",&local_b0);
    std::operator+(&local_70,&local_90," failed.");
    this_00 = std::operator<<((ostream *)&std::cout,(string *)&local_70);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  uVar1 = ntohs(ret._2_2_);
  this->m_port = uVar1;
  local_b4 = len;
  pcVar2 = inet_ntoa((in_addr)len);
  std::__cxx11::string::operator=((string *)&this->m_ip,pcVar2);
  std::operator+(&local_f8,&this->m_ip,":");
  std::__cxx11::to_string(&local_118,(uint)this->m_port);
  std::operator+(&local_d8,&local_f8,&local_118);
  std::__cxx11::string::operator=((string *)&this->m_name,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_f8);
  this->m_connected = true;
  return;
}

Assistant:

Peer::Peer(P2PSocket *socket, SocketResource peer, int num)
    : m_master(socket), m_socket(peer), m_flags{0}
{
    struct sockaddr_in address;
    std::memset(&address, 0, sizeof address);
    socklen_t len = sizeof(address);
    int ret = ::getpeername(peer.resource(), (struct sockaddr *)&address, &len);
    if (ret == -1)
        std::cout << "New peer connection " + std::to_string(num) + " failed." << std::endl;
    m_port = ntohs(address.sin_port);
    m_ip = ::inet_ntoa(address.sin_addr);
    m_name = m_ip + ":" + std::to_string(m_port);
    m_connected = true;
}